

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

bool __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::CheckAllValid
          (TemplatedValidityMask<unsigned_long> *this,idx_t to,idx_t from)

{
  bool bVar1;
  idx_t i;
  bool bVar2;
  
  if (this->validity_mask == (unsigned_long *)0x0) {
    bVar2 = true;
  }
  else {
    do {
      bVar2 = to <= from;
      if (bVar2) {
        return bVar2;
      }
      bVar1 = RowIsValid(this,from);
      from = from + 1;
    } while (bVar1);
  }
  return bVar2;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}